

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

void pztopology::TPZLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_78;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_60;
  Fad<double> x;
  
  Fad<double>::Fad(&x,loc->fStore);
  local_60.fadexpr_.left_.constant_ = 1.0;
  local_60.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.right_.constant_ = 2.0;
  local_78.fadexpr_.right_.defaultVal = 0.0;
  local_78.fadexpr_.left_ = &local_60;
  local_60.fadexpr_.right_ = &x;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
  Fad<double>::operator=(pFVar1,&local_78);
  local_60.fadexpr_.left_.constant_ = 1.0;
  local_60.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.right_.constant_ = 2.0;
  local_78.fadexpr_.right_.defaultVal = 0.0;
  local_78.fadexpr_.left_ = &local_60;
  local_60.fadexpr_.right_ = &x;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                     *)&local_78);
  local_60._0_8_ = 0xbfe0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_60);
  local_60._0_8_ = 0x3fe0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,1);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_60);
  Fad<double>::~Fad(&x);
  return;
}

Assistant:

inline void TPZLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T x = loc[0];
        phi(0,0) = (1.0-x)/2.;
        phi(1,0) = (1.0+x)/2.;
        dphi(0,0) = -0.5;
        dphi(0,1) = 0.5;
    }